

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<char_const(&)[6]>::operator>=
          (result *__return_storage_ptr__,expression_lhs<char_const(&)[6]> *this,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  lest *this_00;
  type lhs;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8;
  text local_a8;
  undefined8 local_88;
  size_type sStack_80;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  const_pointer local_68;
  size_type sStack_60;
  bool local_49;
  result local_48;
  string *local_20;
  basic_string_view<char,_std::char_traits<char>_> *rhs_local;
  expression_lhs<const_char_(&)[6]> *this_local;
  
  local_20 = (string *)rhs;
  rhs_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  this_local = (expression_lhs<const_char_(&)[6]> *)__return_storage_ptr__;
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_78,*(char **)this);
  local_68 = local_78.data_;
  sStack_60 = local_78.size_;
  local_88 = *(undefined8 *)local_20;
  sStack_80 = local_20->_M_string_length;
  lhs.size_ = local_78.size_;
  lhs.data_ = local_78.data_;
  local_49 = nonstd::sv_lite::operator>=
                       (lhs,*(basic_string_view<char,_std::char_traits<char>_> *)local_20);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,">=",&local_109);
  std::__cxx11::string::string(local_e8,local_108);
  to_string<char[6],nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
            (&local_c8,this_00,(char (*) [6])local_e8,local_20,in_R8);
  std::__cxx11::string::string((string *)&local_a8,(string *)&local_c8);
  result::result<bool>(&local_48,&local_49,&local_a8);
  result::result(__return_storage_ptr__,&local_48);
  result::~result(&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }